

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfonticonengine.cpp
# Opt level: O2

void __thiscall
QFontIconEngine::paint(QFontIconEngine *this,QPainter *painter,QRect *rect,Mode mode,State state)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  QColor color;
  uint uVar5;
  undefined4 extraout_EAX;
  QColor *pQVar6;
  QFontEngine *pQVar7;
  ColorRole cr;
  ColorGroup cg;
  long in_FS_OFFSET;
  double dVar8;
  undefined8 uVar9;
  double dVar10;
  int iVar12;
  double dVar13;
  double __x;
  undefined8 extraout_XMM0_Qb;
  undefined1 auVar11 [16];
  int iVar14;
  undefined8 uVar15;
  undefined1 *puVar16;
  undefined8 uVar17;
  QPointF local_e8;
  QRectF local_d8;
  QPainterPath path;
  undefined8 local_b0;
  undefined1 *local_a8;
  undefined1 *puStack_a0;
  undefined1 *local_98;
  glyph_t glyphIndex;
  QArrayDataPointer<char16_t> local_88;
  undefined1 local_68 [16];
  QColor local_58;
  undefined1 local_48 [16];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  QPainter::save(painter);
  local_48._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_48._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  QFont::QFont((QFont *)local_48,&this->m_iconFont);
  QFont::setPixelSize((QFont *)local_48,((rect->y2).m_i - (rect->y1).m_i) + 1);
  local_58._0_6_ = 0xaaaaaaaaaaaa;
  local_58.ct.argb.red = 0xaaaa;
  local_58.ct._4_6_ = 0xaaaaaaaaaaaa;
  local_58._14_2_ = 0xaaaa;
  QColor::QColor(&local_58,black);
  local_68._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_68._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  QPalette::QPalette((QPalette *)local_68);
  switch(mode) {
  case Normal:
  case Active:
    cr = Text;
    break;
  case Disabled:
    cg = Disabled;
    cr = Text;
    goto LAB_0025769f;
  case Selected:
    cr = HighlightedText;
    break;
  default:
    goto switchD_00257673_default;
  }
  cg = Active;
LAB_0025769f:
  pQVar6 = QPalette::color((QPalette *)local_68,cg,cr);
  local_58.ct._4_6_ = (undefined6)((ulong)*(undefined8 *)((long)&pQVar6->ct + 2) >> 0x10);
  local_58._0_6_ = SUB86(*(undefined8 *)pQVar6,0);
  local_58.ct.argb.red = (ushort)((ulong)*(undefined8 *)pQVar6 >> 0x30);
switchD_00257673_default:
  local_88.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_88.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_88.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
  (*(this->super_QIconEngine)._vptr_QIconEngine[0x10])(&local_88,this);
  if ((undefined1 *)local_88.size == (undefined1 *)0x0) {
    uVar5 = (*(this->super_QIconEngine)._vptr_QIconEngine[0x11])(this);
    glyphIndex = uVar5;
    if (uVar5 != 0) {
      pQVar7 = QFontPrivate::engineForScript((QFontPrivate *)local_48._0_8_,2);
      local_98 = &DAT_aaaaaaaaaaaaaaaa;
      local_a8 = &DAT_aaaaaaaaaaaaaaaa;
      puStack_a0 = &DAT_aaaaaaaaaaaaaaaa;
      (*pQVar7->_vptr_QFontEngine[0x1c])(&local_a8,pQVar7,(ulong)uVar5);
      dVar13 = (double)(int)((ulong)local_a8 >> 0x20) * 0.015625;
      puVar16 = local_a8;
      dVar8 = floor((double)(int)local_a8 * 0.015625);
      dVar13 = floor(dVar13);
      uVar9 = CONCAT44((int)dVar13,(int)dVar8);
      uVar15 = 0;
      dVar8 = (double)((int)puStack_a0 + (int)puVar16) * 0.015625;
      __x = (double)((int)((ulong)puStack_a0 >> 0x20) + (int)((ulong)puVar16 >> 0x20)) * 0.015625;
      dVar13 = ceil(dVar8);
      uVar17 = extraout_XMM0_Qb;
      dVar10 = ceil(__x);
      iVar14 = (int)((ulong)uVar9 >> 0x20);
      auVar11._0_4_ = -(uint)((int)uVar9 < (int)dVar13);
      iVar12 = -(uint)(iVar14 < (int)dVar10);
      auVar11._4_4_ = auVar11._0_4_;
      auVar11._8_4_ = iVar12;
      auVar11._12_4_ = iVar12;
      iVar12 = movmskpd(extraout_EAX,auVar11);
      if (iVar12 == 3) {
        local_b0 = CONCAT44(iVar14 * -0x40,(int)uVar9 * -0x40);
        path.d_ptr.d.ptr = (QExplicitlySharedDataPointer<QPainterPathPrivate>)&DAT_aaaaaaaaaaaaaaaa;
        QPainterPath::QPainterPath(&path);
        QPainterPath::setFillRule(&path,WindingFill);
        (*pQVar7->_vptr_QFontEngine[0xf])
                  (pQVar7,&glyphIndex,&local_b0,1,&path,0,dVar8,__x,uVar9,uVar15,dVar13,uVar17);
        local_d8.w._0_4_ = 0xffffffff;
        local_d8.w._4_4_ = 0xffffffff;
        local_d8.h._0_4_ = 0xffffffff;
        local_d8.h._4_4_ = 0xffffffff;
        local_d8.xp._0_4_ = 0xffffffff;
        local_d8.xp._4_4_ = 0xffffffff;
        local_d8.yp._0_4_ = 0xffffffff;
        local_d8.yp._4_4_ = 0xffffffff;
        QPainterPath::boundingRect(&local_d8,&path);
        uVar1 = rect->x1;
        uVar3 = rect->y1;
        uVar2 = rect->x2;
        uVar4 = rect->y2;
        local_e8.xp = ((double)((uVar2 - uVar1) + 1) -
                      (double)CONCAT44(local_d8.w._4_4_,local_d8.w._0_4_)) * 0.5 +
                      ((double)(int)uVar1 - (double)CONCAT44(local_d8.xp._4_4_,local_d8.xp._0_4_));
        local_e8.yp = ((double)((uVar4 - uVar3) + 1) -
                      (double)CONCAT44(local_d8.h._4_4_,local_d8.h._0_4_)) * 0.5 +
                      ((double)(int)uVar3 - (double)CONCAT44(local_d8.yp._4_4_,local_d8.yp._0_4_));
        QPainter::translate(painter,&local_e8);
        QPainter::setRenderHint(painter,Antialiasing,true);
        QPainter::setPen(painter,NoPen);
        color.ct.argb.red = local_58.ct.argb.red;
        color._0_6_ = local_58._0_6_;
        color.ct._4_6_ = local_58.ct._4_6_;
        color._14_2_ = local_58._14_2_;
        QPainter::setBrush(painter,color);
        QPainter::drawPath(painter,&path);
        QPainterPath::~QPainterPath(&path);
      }
    }
  }
  else {
    QPainter::setFont(painter,(QFont *)local_48);
    QPainter::setPen(painter,&local_58);
    QPainter::drawText(painter,rect,0x84,(QString *)&local_88,(QRect *)0x0);
  }
  QPainter::restore(painter);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_88);
  QPalette::~QPalette((QPalette *)local_68);
  QFont::~QFont((QFont *)local_48);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QFontIconEngine::paint(QPainter *painter, const QRect &rect, QIcon::Mode mode, QIcon::State state)
{
    Q_UNUSED(state);

    painter->save();
    QFont renderFont(m_iconFont);
    renderFont.setPixelSize(rect.height());

    QColor color = Qt::black;
    QPalette palette;
    switch (mode) {
    case QIcon::Active:
        color = palette.color(QPalette::Active, QPalette::Text);
        break;
    case QIcon::Normal:
        color = palette.color(QPalette::Active, QPalette::Text);
        break;
    case QIcon::Disabled:
        color = palette.color(QPalette::Disabled, QPalette::Text);
        break;
    case QIcon::Selected:
        color = palette.color(QPalette::Active, QPalette::HighlightedText);
        break;
    }

    const QString text = string();
    if (!text.isEmpty()) {
        painter->setFont(renderFont);
        painter->setPen(color);
        painter->drawText(rect, Qt::AlignCenter, text);
    } else if (glyph_t glyphIndex = glyph()) {
        QFontEngine *engine = QFontPrivate::get(renderFont)->engineForScript(QChar::Script_Common);

        const glyph_metrics_t gm = engine->boundingBox(glyphIndex);
        const int glyph_x = qFloor(gm.x.toReal());
        const int glyph_y = qFloor(gm.y.toReal());
        const int glyph_width = qCeil((gm.x + gm.width).toReal()) - glyph_x;
        const int glyph_height = qCeil((gm.y + gm.height).toReal()) - glyph_y;

        if (glyph_width > 0 && glyph_height > 0) {
            QFixedPoint pt(QFixed(-glyph_x), QFixed(-glyph_y));
            QPainterPath path;
            path.setFillRule(Qt::WindingFill);
            engine->addGlyphsToPath(&glyphIndex, &pt, 1, &path, {});
            // make the glyph fit tightly into rect
            const QRectF pathBoundingRect = path.boundingRect();
            // center the glyph inside the rect
            const QPointF topLeft = rect.topLeft() - pathBoundingRect.topLeft()
                            + (QPointF(rect.width(), rect.height())
                                - QPointF(pathBoundingRect.width(), pathBoundingRect.height())) / 2;
            painter->translate(topLeft);

            painter->setRenderHint(QPainter::Antialiasing);
            painter->setPen(Qt::NoPen);
            painter->setBrush(color);
            painter->drawPath(path);
        }
    }
    painter->restore();
}